

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

ssize_t __thiscall kj::TestRunner::write(TestRunner *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  FdOutputStream local_30;
  
  FdOutputStream::FdOutputStream(&local_30,1);
  FdOutputStream::write(&local_30,__fd,(void *)((long)__buf + -1),__n);
  FdOutputStream::~FdOutputStream(&local_30);
  return extraout_RAX;
}

Assistant:

void write(StringPtr text) {
    FdOutputStream(STDOUT_FILENO).write(text.begin(), text.size());
  }